

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_0::HandleTable::Resize(HandleTable *this)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  LRUHandle **ppLVar4;
  LRUHandle *pLVar5;
  uint uVar6;
  LRUHandle **__s;
  uint uVar7;
  LRUHandle *pLVar8;
  uint uVar9;
  uint32_t i;
  ulong uVar10;
  long in_FS_OFFSET;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = this->elems_;
  uVar2 = 4;
  do {
    uVar6 = uVar2;
    uVar2 = uVar6 * 2;
  } while (uVar6 < uVar1);
  __s = (LRUHandle **)operator_new__((ulong)uVar6 << 3);
  memset(__s,0,(ulong)uVar6 << 3);
  uVar2 = this->length_;
  ppLVar4 = this->list_;
  uVar7 = 0;
  for (uVar10 = 0; uVar10 != uVar2; uVar10 = uVar10 + 1) {
    pLVar8 = ppLVar4[uVar10];
    while (pLVar8 != (LRUHandle *)0x0) {
      pLVar5 = pLVar8->next_hash;
      uVar9 = pLVar8->hash & uVar6 - 1;
      pLVar8->next_hash = __s[uVar9];
      __s[uVar9] = pLVar8;
      uVar7 = uVar7 + 1;
      pLVar8 = pLVar5;
    }
  }
  if (uVar1 == uVar7) {
    if (ppLVar4 != (LRUHandle **)0x0) {
      operator_delete__(ppLVar4);
    }
    this->list_ = __s;
    this->length_ = uVar6;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("elems_ == count",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/util/cache.cc"
                ,0x8e,"void leveldb::(anonymous namespace)::HandleTable::Resize()");
}

Assistant:

void Resize() {
    uint32_t new_length = 4;
    while (new_length < elems_) {
      new_length *= 2;
    }
    LRUHandle** new_list = new LRUHandle*[new_length];
    memset(new_list, 0, sizeof(new_list[0]) * new_length);
    uint32_t count = 0;
    for (uint32_t i = 0; i < length_; i++) {
      LRUHandle* h = list_[i];
      while (h != nullptr) {
        LRUHandle* next = h->next_hash;
        uint32_t hash = h->hash;
        LRUHandle** ptr = &new_list[hash & (new_length - 1)];
        h->next_hash = *ptr;
        *ptr = h;
        h = next;
        count++;
      }
    }
    assert(elems_ == count);
    delete[] list_;
    list_ = new_list;
    length_ = new_length;
  }